

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O1

bool bssl::ssl_add_client_hello(SSL_HANDSHAKE *hs)

{
  SSL *pSVar1;
  ECHConfig *pEVar2;
  _func_bool_SSL_ptr_Array<unsigned_char> *p_Var3;
  ssl_client_hello_type_t type;
  bool bVar4;
  size_t *out_binder_len;
  size_t extraout_RDX;
  Span<unsigned_char> msg_00;
  Array<unsigned_char> AVar5;
  bool needs_psk_binder;
  Array<unsigned_char> msg;
  CBB body;
  ScopedCBB cbb;
  bool local_b9;
  Array<unsigned_char> local_b8;
  SSLTranscript *local_a8;
  ulong uStack_a0;
  CBB local_90;
  CBB local_60;
  
  pSVar1 = hs->ssl;
  CBB_zero(&local_60);
  pEVar2 = (hs->selected_ech_config)._M_t.
           super___uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::ECHConfig_*,_false>._M_head_impl;
  local_b8.data_ = (uchar *)0x0;
  local_b8.size_ = 0;
  bVar4 = (*pSVar1->method->init_message)(pSVar1,&local_60,&local_90,'\x01');
  if (bVar4) {
    type = (uint)(pEVar2 != (ECHConfig *)0x0) * 2;
    bVar4 = ssl_write_client_hello_without_extensions(hs,&local_90,type,false);
    if (bVar4) {
      out_binder_len = (size_t *)CBB_len(&local_90);
      bVar4 = ssl_add_clienthello_tlsext
                        (hs,&local_90,(CBB *)0x0,&local_b9,type,(size_t)out_binder_len);
      if (bVar4) {
        bVar4 = (*pSVar1->method->finish_message)(pSVar1,&local_60,&local_b8);
        if (bVar4) {
          if (local_b9 == true) {
            if (pEVar2 != (ECHConfig *)0x0) {
              __assert_fail("type != ssl_client_hello_outer",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake_client.cc"
                            ,0xf4,"bool bssl::ssl_add_client_hello(SSL_HANDSHAKE *)");
            }
            msg_00.size_ = 0;
            msg_00.data_ = (uchar *)local_b8.size_;
            bVar4 = tls13_write_psk_binder
                              ((bssl *)hs,(SSL_HANDSHAKE *)&hs->transcript,
                               (SSLTranscript *)local_b8.data_,msg_00,out_binder_len);
            if (!bVar4) goto LAB_00145836;
          }
          p_Var3 = pSVar1->method->add_message;
          local_a8 = (SSLTranscript *)0x0;
          uStack_a0 = 0;
          OPENSSL_free((void *)0x0);
          local_a8 = (SSLTranscript *)local_b8.data_;
          uStack_a0 = local_b8.size_;
          local_b8.data_ = (uchar *)0x0;
          local_b8.size_ = 0;
          AVar5.size_ = extraout_RDX;
          AVar5.data_ = (uchar *)&local_a8;
          bVar4 = (*p_Var3)(pSVar1,AVar5);
          OPENSSL_free(local_a8);
          local_a8 = (SSLTranscript *)0x0;
          uStack_a0 = 0;
          goto LAB_00145838;
        }
      }
    }
  }
LAB_00145836:
  bVar4 = false;
LAB_00145838:
  OPENSSL_free(local_b8.data_);
  CBB_cleanup(&local_60);
  return bVar4;
}

Assistant:

bool ssl_add_client_hello(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  ScopedCBB cbb;
  CBB body;
  ssl_client_hello_type_t type = hs->selected_ech_config
                                     ? ssl_client_hello_outer
                                     : ssl_client_hello_unencrypted;
  bool needs_psk_binder;
  Array<uint8_t> msg;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_CLIENT_HELLO) ||
      !ssl_write_client_hello_without_extensions(hs, &body, type,
                                                 /*empty_session_id=*/false) ||
      !ssl_add_clienthello_tlsext(hs, &body, /*out_encoded=*/nullptr,
                                  &needs_psk_binder, type, CBB_len(&body)) ||
      !ssl->method->finish_message(ssl, cbb.get(), &msg)) {
    return false;
  }

  // Now that the length prefixes have been computed, fill in the placeholder
  // PSK binder.
  if (needs_psk_binder) {
    // ClientHelloOuter cannot have a PSK binder. Otherwise the
    // ClientHellOuterAAD computation would break.
    assert(type != ssl_client_hello_outer);
    if (!tls13_write_psk_binder(hs, hs->transcript, Span(msg),
                                /*out_binder_len=*/0)) {
      return false;
    }
  }

  return ssl->method->add_message(ssl, std::move(msg));
}